

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.cpp
# Opt level: O1

ostream * operator<<(ostream *out,Task *task)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)out,task->length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,task->id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return out;
}

Assistant:

ostream& operator<<(ostream& out, const Task& task){ 
	out << "(" << task.length << ", " << task.id <<")"; 
	return out; 
}